

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O3

void __thiscall
vkt::DynamicState::anon_unknown_4::ViewportStateBaseCase::initialize(ViewportStateBaseCase *this)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  RGBA local_6c;
  float local_68 [2];
  float afStack_60 [2];
  PositionColorVertex local_58;
  
  (this->super_DynamicStateBaseClass).m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  local_6c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_6c);
  local_58.position.m_data[0] = -0.5;
  local_58.position.m_data[1] = 0.5;
  local_58.position.m_data[2] = 1.0;
  local_58.position.m_data[3] = 1.0;
  local_58.color.m_data[0] = local_68[0];
  local_58.color.m_data[1] = local_68[1];
  local_58.color.m_data[2] = afStack_60[0];
  local_58.color.m_data[3] = afStack_60[1];
  this_00 = &(this->super_DynamicStateBaseClass).m_data;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_58);
  local_6c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_6c);
  local_58.position.m_data[0] = 0.5;
  local_58.position.m_data[1] = 0.5;
  local_58.position.m_data[2] = 1.0;
  local_58.position.m_data[3] = 1.0;
  local_58.color.m_data[0] = local_68[0];
  local_58.color.m_data[1] = local_68[1];
  local_58.color.m_data[2] = afStack_60[0];
  local_58.color.m_data[3] = afStack_60[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_58);
  local_6c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_6c);
  local_58.position.m_data[0] = -0.5;
  local_58.position.m_data[1] = -0.5;
  local_58.position.m_data[2] = 1.0;
  local_58.position.m_data[3] = 1.0;
  local_58.color.m_data[0] = local_68[0];
  local_58.color.m_data[1] = local_68[1];
  local_58.color.m_data[2] = afStack_60[0];
  local_58.color.m_data[3] = afStack_60[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_58);
  local_6c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_6c);
  local_58.position.m_data[0] = 0.5;
  local_58.position.m_data[1] = -0.5;
  local_58.position.m_data[2] = 1.0;
  local_58.position.m_data[3] = 1.0;
  local_58.color.m_data[0] = local_68[0];
  local_58.color.m_data[1] = local_68[1];
  local_58.color.m_data[2] = afStack_60[0];
  local_58.color.m_data[3] = afStack_60[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_58);
  DynamicStateBaseClass::initialize(&this->super_DynamicStateBaseClass);
  return;
}

Assistant:

void initialize(void)
	{
		m_topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		DynamicStateBaseClass::initialize();
	}